

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O2

void __thiscall tonk::UDPSocket::Shutdown(UDPSocket *this)

{
  __shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           *)&this->Socket,(pointer)0x0);
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->AsioConnectStrand).
              super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>,&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  return;
}

Assistant:

void UDPSocket::Shutdown()
{
    TONK_DEBUG_ASSERT(OutstandingSends == 0);
    TONK_DEBUG_ASSERT(OutstandingRecvs == 0);

    Socket = nullptr;
    AsioConnectStrand = nullptr;
}